

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomType.cpp
# Opt level: O0

bool __thiscall OpenMD::AtomType::isSC(AtomType *this)

{
  bool bVar1;
  string *in_RDI;
  AtomType *this_00;
  undefined1 local_29 [9];
  allocator<char> *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffff0;
  
  this_00 = (AtomType *)local_29;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  bVar1 = hasProperty(this_00,in_RDI);
  std::__cxx11::string::~string((string *)(local_29 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_29);
  return bVar1;
}

Assistant:

bool AtomType::isSC() { return hasProperty("SC"); }